

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  bool bVar7;
  timediff_t tVar8;
  Curl_tree *pCVar9;
  ulong uVar10;
  Curl_tree *pCVar11;
  Curl_tree *pCVar12;
  Curl_tree *pCVar13;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  Curl_tree local_68;
  
  uVar10 = i._8_8_;
  newer.tv_sec = i.tv_sec;
  pCVar11 = &local_68;
  pCVar12 = &local_68;
  if (t == (Curl_tree *)0x0) {
    t = (Curl_tree *)0x0;
  }
  else {
    local_68.smaller = (Curl_tree *)0x0;
    local_68.larger = (Curl_tree *)0x0;
    do {
      uVar1 = (t->key).tv_sec;
      uVar2 = (t->key).tv_usec;
      older.tv_usec = uVar2;
      older.tv_sec = uVar1;
      newer._8_8_ = uVar10 & 0xffffffff;
      older._12_4_ = 0;
      tVar8 = Curl_timediff_us(newer,older);
      if (tVar8 < 0) {
        pCVar9 = t->smaller;
        if (pCVar9 == (Curl_tree *)0x0) goto LAB_0015aa79;
        uVar5 = (pCVar9->key).tv_sec;
        uVar6 = (pCVar9->key).tv_usec;
        older_01.tv_usec = uVar6;
        older_01.tv_sec = uVar5;
        newer_01._8_8_ = uVar10 & 0xffffffff;
        newer_01.tv_sec = newer.tv_sec;
        older_01._12_4_ = 0;
        tVar8 = Curl_timediff_us(newer_01,older_01);
        pCVar9 = t;
        if (tVar8 < 0) {
          pCVar9 = t->smaller;
          t->smaller = pCVar9->larger;
          pCVar9->larger = t;
          if (pCVar9->smaller == (Curl_tree *)0x0) goto LAB_0015aa85;
        }
        pCVar12->smaller = pCVar9;
        pCVar13 = pCVar9;
LAB_0015aa72:
        bVar7 = true;
        pCVar12 = pCVar9;
        t = pCVar13->smaller;
      }
      else {
        if ((tVar8 != 0) && (pCVar9 = t->larger, pCVar9 != (Curl_tree *)0x0)) {
          uVar3 = (pCVar9->key).tv_sec;
          uVar4 = (pCVar9->key).tv_usec;
          older_00.tv_usec = uVar4;
          older_00.tv_sec = uVar3;
          newer_00._8_8_ = uVar10 & 0xffffffff;
          newer_00.tv_sec = newer.tv_sec;
          older_00._12_4_ = 0;
          tVar8 = Curl_timediff_us(newer_00,older_00);
          pCVar9 = t;
          if (0 < tVar8) {
            pCVar9 = t->larger;
            t->larger = pCVar9->smaller;
            pCVar9->smaller = t;
            if (pCVar9->larger == (Curl_tree *)0x0) {
LAB_0015aa85:
              bVar7 = false;
              t = pCVar9;
              goto LAB_0015aa7b;
            }
          }
          pCVar11->larger = pCVar9;
          pCVar13 = (Curl_tree *)&pCVar9->larger;
          pCVar11 = pCVar9;
          pCVar9 = pCVar12;
          goto LAB_0015aa72;
        }
LAB_0015aa79:
        bVar7 = false;
      }
LAB_0015aa7b:
    } while (bVar7);
    pCVar11->larger = t->smaller;
    pCVar12->smaller = t->larger;
    t->smaller = local_68.larger;
    t->larger = local_68.smaller;
  }
  return t;
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;

  if(!t)
    return NULL;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    timediff_t comp = compare(i, t->key);
    if(comp < 0) {
      if(!t->smaller)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(!t->smaller)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(!t->larger)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(!t->larger)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}